

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concavity.cpp
# Opt level: O1

bool ConvexDecomposition::featureMatch
               (CTri *m,CTriVector *tris,ConvexDecompInterface *callback,CTriVector *input_mesh)

{
  Vector3d *dir;
  float fVar1;
  float fVar2;
  float fVar3;
  CTri *this;
  bool bVar4;
  bool bVar5;
  CTri *pCVar6;
  float fVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  float local_64;
  
  m->mConcavity = 0.0;
  this = (tris->
         super__Vector_base<ConvexDecomposition::CTri,_std::allocator<ConvexDecomposition::CTri>_>).
         _M_impl.super__Vector_impl_data._M_start;
  if (this == (tris->
              super__Vector_base<ConvexDecomposition::CTri,_std::allocator<ConvexDecomposition::CTri>_>
              )._M_impl.super__Vector_impl_data._M_finish) {
    bVar5 = false;
  }
  else {
    dir = &m->mNormal;
    local_64 = 0.707;
    bVar5 = false;
    do {
      pCVar6 = this + 1;
      bVar4 = CTri::samePlane(this,m);
      if (bVar4) {
        bVar5 = false;
      }
      else {
        fVar7 = (this->mNormal).x;
        auVar9 = vfmadd231ss_fma(ZEXT416((uint)((this->mNormal).y * (m->mNormal).y)),
                                 ZEXT416((uint)fVar7),ZEXT416((uint)(m->mNormal).x));
        auVar9 = vfmadd132ss_fma(ZEXT416((uint)(this->mNormal).z),auVar9,
                                 ZEXT416((uint)(m->mNormal).z));
        if (local_64 < auVar9._0_4_) {
          fVar1 = (this->mNormal).y;
          fVar2 = (this->mNormal).z;
          fVar3 = this->mPlaneD;
          auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * (m->mP1).y)),ZEXT416((uint)fVar7),
                                   ZEXT416((uint)(m->mP1).x));
          auVar8 = vfmadd231ss_fma(auVar8,ZEXT416((uint)fVar2),ZEXT416((uint)(m->mP1).z));
          if (fVar3 + auVar8._0_4_ <= 0.001) {
            auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * (m->mP2).y)),ZEXT416((uint)fVar7),
                                     ZEXT416((uint)(m->mP2).x));
            auVar8 = vfmadd231ss_fma(auVar8,ZEXT416((uint)fVar2),ZEXT416((uint)(m->mP2).z));
            if (fVar3 + auVar8._0_4_ <= 0.001) {
              auVar8 = vfmadd132ss_fma(ZEXT416((uint)fVar7),ZEXT416((uint)(fVar1 * (m->mP3).y)),
                                       ZEXT416((uint)(m->mP3).x));
              auVar8 = vfmadd132ss_fma(ZEXT416((uint)fVar2),auVar8,ZEXT416((uint)(m->mP3).z));
              if (fVar3 + auVar8._0_4_ <= 0.001) goto LAB_00934883;
            }
          }
          CTri::raySect(this,&m->mP1,dir,&m->mNear1);
          CTri::raySect(this,&m->mP2,dir,&m->mNear2);
          CTri::raySect(this,&m->mP3,dir,&m->mNear3);
          bVar5 = true;
          local_64 = auVar9._0_4_;
        }
      }
LAB_00934883:
      this = pCVar6;
    } while (!bVar4 && pCVar6 != (tris->
                                 super__Vector_base<ConvexDecomposition::CTri,_std::allocator<ConvexDecomposition::CTri>_>
                                 )._M_impl.super__Vector_impl_data._M_finish);
  }
  if (bVar5) {
    fVar7 = (m->mNear1).y - (m->mP1).y;
    auVar9 = ZEXT416((uint)((m->mNear1).x - (m->mP1).x));
    auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar7 * fVar7)),auVar9,auVar9);
    auVar8 = ZEXT416((uint)((m->mNear1).z - (m->mP1).z));
    auVar9 = vfmadd231ss_fma(auVar9,auVar8,auVar8);
    if (auVar9._0_4_ < 0.0) {
      fVar7 = sqrtf(auVar9._0_4_);
    }
    else {
      auVar9 = vsqrtss_avx(auVar9,auVar9);
      fVar7 = auVar9._0_4_;
    }
    m->mC1 = fVar7;
    fVar7 = (m->mNear2).y - (m->mP2).y;
    auVar9 = ZEXT416((uint)((m->mNear2).x - (m->mP2).x));
    auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar7 * fVar7)),auVar9,auVar9);
    auVar8 = ZEXT416((uint)((m->mNear2).z - (m->mP2).z));
    auVar9 = vfmadd231ss_fma(auVar9,auVar8,auVar8);
    if (auVar9._0_4_ < 0.0) {
      fVar7 = sqrtf(auVar9._0_4_);
    }
    else {
      auVar9 = vsqrtss_avx(auVar9,auVar9);
      fVar7 = auVar9._0_4_;
    }
    m->mC2 = fVar7;
    fVar7 = (m->mNear3).y - (m->mP3).y;
    auVar9 = ZEXT416((uint)((m->mNear3).x - (m->mP3).x));
    auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar7 * fVar7)),auVar9,auVar9);
    auVar8 = ZEXT416((uint)((m->mNear3).z - (m->mP3).z));
    auVar9 = vfmadd231ss_fma(auVar9,auVar8,auVar8);
    if (auVar9._0_4_ < 0.0) {
      fVar7 = sqrtf(auVar9._0_4_);
    }
    else {
      auVar9 = vsqrtss_avx(auVar9,auVar9);
      fVar7 = auVar9._0_4_;
    }
    m->mC3 = fVar7;
    m->mConcavity = m->mC1;
    if (m->mC1 < m->mC2) {
      m->mConcavity = m->mC2;
    }
    if (m->mConcavity < fVar7) {
      m->mConcavity = fVar7;
    }
  }
  return bVar5;
}

Assistant:

bool featureMatch(CTri &m,const CTriVector &tris,ConvexDecompInterface *callback,const CTriVector &input_mesh)
{

  bool ret = false;

  float neardot = 0.707f;

  m.mConcavity = 0;

	//gLog->Display("*********** FEATURE MATCH *************\r\n");
	//gLog->Display("Plane: %0.4f,%0.4f,%0.4f   %0.4f\r\n", m.mNormal.x, m.mNormal.y, m.mNormal.z, m.mPlaneD );
	//gLog->Display("*********************************************\r\n");

	CTriVector::const_iterator i;

	CTri nearest;


	for (i=tris.begin(); i!=tris.end(); ++i)
	{
		const CTri &t = (*i);


  	//gLog->Display("   HullPlane: %0.4f,%0.4f,%0.4f   %0.4f\r\n", t.mNormal.x, t.mNormal.y, t.mNormal.z, t.mPlaneD );

		if ( t.samePlane(m) )
		{
			//gLog->Display("*** PLANE MATCH!!!\r\n");
			ret = false;
			break;
		}

	  float dot = t.mNormal.Dot(m.mNormal);

	  if ( dot > neardot )
	  {

      float d1 = t.planeDistance( m.mP1 );
      float d2 = t.planeDistance( m.mP2 );
      float d3 = t.planeDistance( m.mP3 );

      if ( d1 > 0.001f || d2 > 0.001f || d3 > 0.001f ) // can't be near coplaner!
      {

  	  	neardot = dot;

        Vector3d n1,n2,n3;

        t.raySect( m.mP1, m.mNormal, m.mNear1 );
        t.raySect( m.mP2, m.mNormal, m.mNear2 );
        t.raySect( m.mP3, m.mNormal, m.mNear3 );

				nearest = t;

	  		ret = true;
		  }

	  }
	}

	if ( ret )
	{
    if ( 0 )
    {
      CTriVector::const_iterator i;
      for (i=input_mesh.begin(); i!=input_mesh.end(); ++i)
      {
        const CTri &c = (*i);
        if ( c.mI1 != m.mI1 && c.mI2 != m.mI2 && c.mI3 != m.mI3 )
        {
  			  c.clip( m.mP1, m.mNear1 );
				  c.clip( m.mP2, m.mNear2 );
				  c.clip( m.mP3, m.mNear3 );
        }
      }
    }

	  //gLog->Display("*********************************************\r\n");
  	//gLog->Display("   HullPlaneNearest: %0.4f,%0.4f,%0.4f   %0.4f\r\n", nearest.mNormal.x, nearest.mNormal.y, nearest.mNormal.z, nearest.mPlaneD );

		m.mC1 = m.mP1.Distance( m.mNear1 );
		m.mC2 = m.mP2.Distance( m.mNear2 );
		m.mC3 = m.mP3.Distance( m.mNear3 );

		m.mConcavity = m.mC1;

		if ( m.mC2 > m.mConcavity ) m.mConcavity = m.mC2;
		if ( m.mC3 > m.mConcavity ) m.mConcavity = m.mC3;

    #if 0
		callback->ConvexDebugTri( m.mP1.Ptr(), m.mP2.Ptr(), m.mP3.Ptr(), 0x00FF00 );
		callback->ConvexDebugTri( m.mNear1.Ptr(), m.mNear2.Ptr(), m.mNear3.Ptr(), 0xFF0000 );

		callback->ConvexDebugTri( m.mP1.Ptr(), m.mP1.Ptr(), m.mNear1.Ptr(), 0xFFFF00 );
		callback->ConvexDebugTri( m.mP2.Ptr(), m.mP2.Ptr(), m.mNear2.Ptr(), 0xFFFF00 );
		callback->ConvexDebugTri( m.mP3.Ptr(), m.mP3.Ptr(), m.mNear3.Ptr(), 0xFFFF00 );
    #endif

	}
	else
	{
		//gLog->Display("No match\r\n");
	}

	//gLog->Display("*********************************************\r\n");
	return ret;
}